

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChClassFactory.cpp
# Opt level: O1

ChClassFactory * chrono::ChClassFactory::GetGlobalClassFactory(void)

{
  if (GetGlobalClassFactory::mfactory == (ChClassFactory *)0x0) {
    GetGlobalClassFactory::mfactory = (ChClassFactory *)::operator_new(0x70);
    (GetGlobalClassFactory::mfactory->class_map)._M_h._M_buckets =
         &(GetGlobalClassFactory::mfactory->class_map)._M_h._M_single_bucket;
    (GetGlobalClassFactory::mfactory->class_map)._M_h._M_bucket_count = 1;
    (GetGlobalClassFactory::mfactory->class_map)._M_h._M_before_begin._M_nxt =
         (_Hash_node_base *)0x0;
    (GetGlobalClassFactory::mfactory->class_map)._M_h._M_element_count = 0;
    (GetGlobalClassFactory::mfactory->class_map)._M_h._M_rehash_policy._M_max_load_factor = 1.0;
    (GetGlobalClassFactory::mfactory->class_map)._M_h._M_rehash_policy._M_next_resize = 0;
    (GetGlobalClassFactory::mfactory->class_map)._M_h._M_single_bucket = (__node_base_ptr)0x0;
    (GetGlobalClassFactory::mfactory->class_map_typeids)._M_h._M_buckets =
         &(GetGlobalClassFactory::mfactory->class_map_typeids)._M_h._M_single_bucket;
    (GetGlobalClassFactory::mfactory->class_map_typeids)._M_h._M_bucket_count = 1;
    (GetGlobalClassFactory::mfactory->class_map_typeids)._M_h._M_before_begin._M_nxt =
         (_Hash_node_base *)0x0;
    (GetGlobalClassFactory::mfactory->class_map_typeids)._M_h._M_element_count = 0;
    (GetGlobalClassFactory::mfactory->class_map_typeids)._M_h._M_rehash_policy._M_max_load_factor =
         1.0;
    (GetGlobalClassFactory::mfactory->class_map_typeids)._M_h._M_rehash_policy._M_next_resize = 0;
    (GetGlobalClassFactory::mfactory->class_map_typeids)._M_h._M_single_bucket =
         (__node_base_ptr)0x0;
  }
  return GetGlobalClassFactory::mfactory;
}

Assistant:

ChClassFactory* ChClassFactory::GetGlobalClassFactory() {
    static ChClassFactory* mfactory = 0;
    if (!mfactory)
        mfactory = new ChClassFactory;
    return mfactory;
}